

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFreloc.c
# Opt level: O2

void NFreloc(NF_link_map *l,ProxyRecord *records)

{
  uint uVar1;
  Elf64_Xword EVar2;
  Elf64_Xword EVar3;
  NF_link_map *pNVar4;
  Elf64_Xword EVar5;
  Elf64_Xword EVar6;
  Elf32_Word *pEVar7;
  Elf64_Dyn *pEVar8;
  int iVar9;
  Elf64_Rela *it;
  long *plVar10;
  undefined8 uVar11;
  NF_link_map **ppNVar12;
  Elf64_Dyn *pEVar13;
  ulong uVar14;
  byte *pbVar15;
  long lVar16;
  long lVar17;
  long *plVar18;
  void **ppvVar19;
  long *plVar20;
  ulong uVar21;
  void *pvVar22;
  byte *__s2;
  
  if (l->l_info[7] != (Elf64_Dyn *)0x0) {
    ranges[0].start = (l->l_info[7]->d_un).d_ptr;
    ranges[0].size = (l->l_info[8]->d_un).d_ptr;
    ranges[0].nrelative = (l->l_info[0x22]->d_un).d_val;
  }
  if (l->l_info[0x14] != (Elf64_Dyn *)0x0) {
    ranges[1].start = (l->l_info[0x17]->d_un).d_ptr;
    ranges[1].size = (l->l_info[2]->d_un).d_ptr;
  }
  lVar16 = 0;
  do {
    if (lVar16 == 2) {
      return;
    }
    plVar10 = (long *)ranges[lVar16].start;
    plVar20 = plVar10 + ranges[lVar16].nrelative * 3;
    plVar18 = (long *)(ranges[lVar16].size + (long)plVar10);
    if (ranges[lVar16].nrelative != 0) {
      for (; plVar10 < plVar20; plVar10 = plVar10 + 3) {
        *(uint64_t *)(*plVar10 + l->l_addr) = plVar10[2] + l->l_addr;
      }
    }
    EVar2 = (l->l_info[6]->d_un).d_val;
    EVar3 = (l->l_info[5]->d_un).d_val;
    for (; plVar20 < plVar18; plVar20 = plVar20 + 3) {
      if ((int)plVar20[1] == 0x25) {
        uVar11 = (*(code *)(plVar20[2] + l->l_addr))();
        *(undefined8 *)(*plVar20 + l->l_addr) = uVar11;
      }
      else {
        __s2 = (byte *)(*(uint *)(EVar2 + ((ulong)plVar20[1] >> 0x20) * 0x18) + EVar3);
        for (ppNVar12 = l->l_search_list; pNVar4 = *ppNVar12, ppvVar19 = &records->pointer,
            pNVar4 != (NF_link_map *)0x0; ppNVar12 = ppNVar12 + 1) {
          while (pvVar22 = *ppvVar19, pvVar22 != (void *)0x0) {
            iVar9 = strcmp(((ProxyRecord *)(ppvVar19 + -1))->name,(char *)__s2);
            ppvVar19 = ppvVar19 + 2;
            if (iVar9 == 0) goto LAB_0010311c;
          }
          pEVar8 = pNVar4->l_ld + -1;
          do {
            pEVar13 = pEVar8;
            pEVar8 = pEVar13 + 1;
          } while (pEVar13[1].d_tag != 5);
          EVar5 = pEVar13[1].d_un.d_val;
          do {
            pEVar13 = pEVar8;
            pEVar8 = pEVar13 + 1;
          } while (pEVar13->d_tag != 6);
          EVar6 = (pEVar13->d_un).d_val;
          uVar14 = 0x1505;
          for (pbVar15 = __s2; (ulong)*pbVar15 != 0; pbVar15 = pbVar15 + 1) {
            uVar14 = uVar14 * 0x21 + (ulong)*pbVar15;
          }
          if ((((uint)(pNVar4->l_gnu_bitmask
                       [(uint)(uVar14 >> 6) & 0x3ffffff & pNVar4->l_gnu_bitmask_idxbits] >>
                      ((byte)uVar14 & 0x3f)) &
                (uint)(pNVar4->l_gnu_bitmask
                       [(uint)(uVar14 >> 6) & 0x3ffffff & pNVar4->l_gnu_bitmask_idxbits] >>
                      ((byte)((uVar14 & 0xffffffff) >> ((byte)pNVar4->l_gnu_shift & 0x3f)) & 0x3f))
               & 1) != 0) &&
             ((ulong)pNVar4->l_gnu_buckets[(uVar14 & 0xffffffff) % (ulong)pNVar4->l_nbuckets] != 0))
          {
            pEVar7 = pNVar4->l_gnu_chain_zero;
            uVar21 = (ulong)pNVar4->l_gnu_buckets[(uVar14 & 0xffffffff) % (ulong)pNVar4->l_nbuckets]
                     << 2;
LAB_0010309f:
            uVar1 = *(uint *)((long)pEVar7 + uVar21);
            if (1 < ((uint)uVar14 ^ uVar1)) goto LAB_001030d3;
            lVar17 = (uVar21 >> 2 & 0xffffffff) * 0x18;
            iVar9 = strcmp((char *)(*(uint *)(EVar6 + lVar17) + EVar5),(char *)__s2);
            if (iVar9 != 0) goto LAB_001030d3;
            pvVar22 = (void *)(pNVar4->l_addr + *(long *)(EVar6 + lVar17 + 8));
LAB_0010311c:
            *(long *)(*plVar20 + l->l_addr) = (long)pvVar22 + plVar20[2];
            break;
          }
LAB_001030dd:
        }
      }
    }
    lVar16 = lVar16 + 1;
  } while( true );
LAB_001030d3:
  uVar21 = uVar21 + 4;
  if ((uVar1 & 1) != 0) goto LAB_001030dd;
  goto LAB_0010309f;
}

Assistant:

void NFreloc(struct NF_link_map *l, const ProxyRecord *records)
{
    /* set up range[0] for relative reloc and global vars */
    if (l->l_info[DT_RELA])
    {
        ranges[0].start = l->l_info[DT_RELA]->d_un.d_ptr;
        ranges[0].size = l->l_info[DT_RELASZ]->d_un.d_val;
        ranges[0].nrelative = l->l_info[34]->d_un.d_val; //relacount is now at 34
    }
    /* set up range[1] for function reloc */
    if (l->l_info[DT_PLTREL]) //TODO: Also check reloc type: it is REL/RELA? Only 2 options?
    {
        ranges[1].start = l->l_info[DT_JMPREL]->d_un.d_ptr;
        ranges[1].size = l->l_info[DT_PLTRELSZ]->d_un.d_val;
        //TODO: check lazy or not here
    }

    /* do actucal reloc here using ranges set up */
    for (int i = 0; i < 2; ++i)
        do_reloc(l, &ranges[i], records);

    /* UPD: this is totally wrong, for unload search list should be in the destructor of the NF */
    /* NFclose function should take care of this */
    /* now the reloc is done, dlclose the dlopened objs before */
    /* struct link_map **lm = l -> l_search_list;
    while(*lm)
    {
        dlclose(*lm);
        lm++;
    } */
    //TODO: add a mprotect to protect the already relocated entries from writing
}